

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteList.c
# Opt level: O3

void Io_WriteListEdge(FILE *pFile,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = Abc_ObjName(pObj);
  fprintf((FILE *)pFile,"%-10s >    ",pcVar2);
  if (0 < (pObj->vFanouts).nSize) {
    uVar3 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar3]];
      pcVar2 = Abc_ObjName(pObj_00);
      fprintf((FILE *)pFile," %s",pcVar2);
      pcVar2 = Abc_ObjName(pObj);
      fprintf((FILE *)pFile," ([%s_to_",pcVar2);
      pcVar2 = Abc_ObjName(pObj_00);
      fprintf((FILE *)pFile,"%s] = %d)",pcVar2,0);
      iVar1 = (pObj->vFanouts).nSize;
      if (uVar3 != iVar1 - 1) {
        fputc(0x2c,(FILE *)pFile);
        iVar1 = (pObj->vFanouts).nSize;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)iVar1);
  }
  fputc(0x2e,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteListEdge( FILE * pFile, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    fprintf( pFile, "%-10s >    ", Abc_ObjName(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        fprintf( pFile, " %s", Abc_ObjName(pFanout) );
        fprintf( pFile, " ([%s_to_", Abc_ObjName(pObj) );
//        fprintf( pFile, "%s] = %d)", Abc_ObjName(pFanout), Seq_ObjFanoutL(pObj, pFanout) );
        fprintf( pFile, "%s] = %d)", Abc_ObjName(pFanout), 0 );
        if ( i != Abc_ObjFanoutNum(pObj) - 1 )
            fprintf( pFile, "," );
    }
    fprintf( pFile, "." );
    fprintf( pFile, "\n" );
}